

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<signed_char,unsigned_char>
          (BaseAppender *this,Vector *col,char input)

{
  uchar uVar1;
  
  uVar1 = Cast::Operation<signed_char,unsigned_char>(input);
  col->data[(this->chunk).count] = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}